

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseFirewall.cpp
# Opt level: O2

void tonk::Initialize(void)

{
  ostringstream *this;
  OutputWorker *this_00;
  LogStringBuffer local_198;
  
  if (DAT_0019db90 < 2) {
    this = &local_198.LogStream;
    local_198.ChannelName = ModuleLogger;
    local_198.LogLevel = Debug;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::operator<<((ostream *)this,(string *)&DAT_0019dbc0);
    std::operator<<((ostream *)this,"Platform does not support firewall modifications");
    this_00 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_00,&local_198);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  }
  return;
}

Assistant:

void Firewall_Initialize()
{
    Initialize();
}